

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TracingServiceState_TracingSession::Serialize
          (TracingServiceState_TracingSession *this,Message *msg)

{
  uint *puVar1;
  uint8_t *src_begin;
  uint *it;
  uint *puVar2;
  
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 2) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,1,this->id_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 4) != 0) {
    protozero::Message::AppendVarInt<int>(msg,2,this->consumer_uid_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 8) != 0) {
    protozero::Message::AppendBytes
              (msg,3,(this->state_)._M_dataplus._M_p,(this->state_)._M_string_length);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x10) != 0) {
    protozero::Message::AppendBytes
              (msg,4,(this->unique_session_name_)._M_dataplus._M_p,
               (this->unique_session_name_)._M_string_length);
  }
  puVar1 = (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->buffer_size_kb_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,5,*puVar2);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->duration_ms_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x80) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,7,this->num_data_sources_);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x100) != 0) {
    protozero::Message::AppendVarInt<long>(msg,8,this->start_realtime_ns_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void TracingServiceState_TracingSession::Serialize(::protozero::Message* msg) const {
  // Field 1: id
  if (_has_field_[1]) {
    msg->AppendVarInt(1, id_);
  }

  // Field 2: consumer_uid
  if (_has_field_[2]) {
    msg->AppendVarInt(2, consumer_uid_);
  }

  // Field 3: state
  if (_has_field_[3]) {
    msg->AppendString(3, state_);
  }

  // Field 4: unique_session_name
  if (_has_field_[4]) {
    msg->AppendString(4, unique_session_name_);
  }

  // Field 5: buffer_size_kb
  for (auto& it : buffer_size_kb_) {
    msg->AppendVarInt(5, it);
  }

  // Field 6: duration_ms
  if (_has_field_[6]) {
    msg->AppendVarInt(6, duration_ms_);
  }

  // Field 7: num_data_sources
  if (_has_field_[7]) {
    msg->AppendVarInt(7, num_data_sources_);
  }

  // Field 8: start_realtime_ns
  if (_has_field_[8]) {
    msg->AppendVarInt(8, start_realtime_ns_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}